

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O1

int arkCheckNvector(N_Vector tmpl)

{
  N_Vector_Ops p_Var1;
  uint uVar2;
  
  p_Var1 = tmpl->ops;
  uVar2 = 0;
  if ((((((p_Var1->nvclone != (_func_N_Vector_N_Vector *)0x0) &&
         (p_Var1->nvdestroy != (_func_void_N_Vector *)0x0)) &&
        (p_Var1->nvlinearsum != (_func_void_sunrealtype_N_Vector_sunrealtype_N_Vector_N_Vector *)0x0
        )) && ((p_Var1->nvconst != (_func_void_sunrealtype_N_Vector *)0x0 &&
               (p_Var1->nvdiv != (_func_void_N_Vector_N_Vector_N_Vector *)0x0)))) &&
      ((p_Var1->nvscale != (_func_void_sunrealtype_N_Vector_N_Vector *)0x0 &&
       ((p_Var1->nvabs != (_func_void_N_Vector_N_Vector *)0x0 &&
        (p_Var1->nvinv != (_func_void_N_Vector_N_Vector *)0x0)))))) &&
     ((p_Var1->nvaddconst != (_func_void_N_Vector_sunrealtype_N_Vector *)0x0 &&
      (p_Var1->nvmaxnorm != (_func_sunrealtype_N_Vector *)0x0)))) {
    uVar2 = (uint)(p_Var1->nvwrmsnorm != (_func_sunrealtype_N_Vector_N_Vector *)0x0);
  }
  return uVar2;
}

Assistant:

sunbooleantype arkCheckNvector(N_Vector tmpl) /* to be updated?? */
{
  if ((tmpl->ops->nvclone == NULL) || (tmpl->ops->nvdestroy == NULL) ||
      (tmpl->ops->nvlinearsum == NULL) || (tmpl->ops->nvconst == NULL) ||
      (tmpl->ops->nvdiv == NULL) || (tmpl->ops->nvscale == NULL) ||
      (tmpl->ops->nvabs == NULL) || (tmpl->ops->nvinv == NULL) ||
      (tmpl->ops->nvaddconst == NULL) || (tmpl->ops->nvmaxnorm == NULL) ||
      (tmpl->ops->nvwrmsnorm == NULL))
  {
    return (SUNFALSE);
  }
  else { return (SUNTRUE); }
}